

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncInitializer.hpp
# Opt level: O1

ASYNC_TASK_STATUS __thiscall
Diligent::AsyncInitializer::Update(AsyncInitializer *this,bool WaitForCompletion)

{
  AsyncInitializer *this_00;
  uint uVar1;
  atomic<bool> aVar2;
  uint uVar3;
  uint uVar4;
  char (*in_RCX) [40];
  uint uVar5;
  IAsyncTask *pObj;
  _Alloc_hider _Var6;
  bool bVar7;
  string msg;
  string local_50;
  
  uVar5 = *(uint *)this;
  if (uVar5 == 0) {
    FormatString<char[26],char[40]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrStatus != ASYNC_TASK_STATUS_UNKNOWN",in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Update",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/AsyncInitializer.hpp"
               ,0x35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (uVar5 < 3) {
    this_00 = this + 4;
    LOCK();
    aVar2._M_base._M_i = *(__atomic_base<bool> *)(this + 4);
    this[4] = (AsyncInitializer)0x1;
    UNLOCK();
    while (((byte)aVar2._M_base._M_i & 1) != 0) {
      Threading::SpinLock::Wait((SpinLock *)this_00);
      LOCK();
      aVar2._M_base._M_i = *(__atomic_base<bool> *)this_00;
      *this_00 = (AsyncInitializer)0x1;
      UNLOCK();
    }
    RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)&local_50);
    _Var6._M_p = local_50._M_dataplus._M_p;
    if ((long *)local_50._M_dataplus._M_p == (long *)0x0) {
      _Var6._M_p = (pointer)0x0;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 0x10))();
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
    Threading::SpinLock::unlock((SpinLock *)this_00);
    if ((long *)_Var6._M_p == (long *)0x0) {
      uVar3 = 0;
    }
    else {
      if (WaitForCompletion) {
        (**(code **)(*(long *)_Var6._M_p + 0x58))(_Var6._M_p);
      }
      uVar3 = (**(code **)(*(long *)_Var6._M_p + 0x38))(_Var6._M_p);
    }
    if (uVar3 - 3 < 2) {
      while( true ) {
        LOCK();
        aVar2._M_base._M_i = *(__atomic_base<bool> *)this_00;
        *this_00 = (AsyncInitializer)0x1;
        UNLOCK();
        if (((byte)aVar2._M_base._M_i & 1) == 0) break;
        Threading::SpinLock::Wait((SpinLock *)this_00);
      }
      RefCntWeakPtr<Diligent::IAsyncTask>::Release
                ((RefCntWeakPtr<Diligent::IAsyncTask> *)(this + 8));
      Threading::SpinLock::unlock((SpinLock *)this_00);
    }
    if (uVar5 < uVar3) {
      do {
        uVar4 = uVar3;
        if (uVar3 < uVar5) {
          uVar4 = uVar5;
        }
        LOCK();
        uVar1 = *(uint *)this;
        bVar7 = uVar5 == uVar1;
        if (bVar7) {
          *(uint *)this = uVar4;
          uVar1 = uVar5;
        }
        uVar5 = uVar1;
        UNLOCK();
      } while (!bVar7);
    }
    if ((long *)_Var6._M_p != (long *)0x0) {
      (**(code **)(*(long *)_Var6._M_p + 0x10))(_Var6._M_p);
    }
  }
  return *(ASYNC_TASK_STATUS *)this;
}

Assistant:

ASYNC_TASK_STATUS Update(bool WaitForCompletion)
    {
        ASYNC_TASK_STATUS CurrStatus = m_Status.load();
        VERIFY_EXPR(CurrStatus != ASYNC_TASK_STATUS_UNKNOWN);
        if (CurrStatus <= ASYNC_TASK_STATUS_RUNNING)
        {
            RefCntAutoPtr<IAsyncTask> pTask;
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                pTask = m_wpTask.Lock();
            }

            ASYNC_TASK_STATUS NewStatus = ASYNC_TASK_STATUS_UNKNOWN;
            if (pTask)
            {
                if (WaitForCompletion)
                {
                    pTask->WaitForCompletion();
                }
                NewStatus = pTask->GetStatus();
            }

            if (NewStatus == ASYNC_TASK_STATUS_CANCELLED || NewStatus == ASYNC_TASK_STATUS_COMPLETE)
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                m_wpTask.Release();
            }

            if (NewStatus > CurrStatus)
            {
                while (!m_Status.compare_exchange_weak(CurrStatus, (std::max)(CurrStatus, NewStatus)))
                {
                    // If exchange fails, CurrStatus will hold the actual value of m_Status.
                }
            }
        }

        return m_Status.load();
    }